

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,
               vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar1;
  ushort uVar2;
  uchar *puVar3;
  uchar *puVar4;
  iterator iVar5;
  int iVar6;
  uint j;
  long lVar7;
  pointer *pppuVar8;
  uchar **ppuVar9;
  size_t __n;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  uint j_1;
  ulong n_00;
  uint i;
  uchar **ppuVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined4 uVar16;
  array<unsigned_short,_256UL> bucketsize;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < n) {
      ppuVar9 = strings;
      do {
        puVar3 = ppuVar9[1];
        ppuVar9 = ppuVar9 + 1;
        for (ppuVar13 = ppuVar9; strings < ppuVar13; ppuVar13 = ppuVar13 + -1) {
          puVar4 = ppuVar13[-1];
          bVar11 = puVar4[depth];
          bVar12 = puVar3[depth];
          if ((bVar11 != 0) && (lVar7 = depth + 1, bVar11 == bVar12)) {
            do {
              bVar11 = puVar4[lVar7];
              bVar12 = puVar3[lVar7];
              if (bVar11 == 0) break;
              lVar7 = lVar7 + 1;
            } while (bVar11 == bVar12);
          }
          if (bVar11 <= bVar12) break;
          *ppuVar13 = puVar4;
        }
        iVar6 = (int)n;
        *ppuVar13 = puVar3;
        n = (size_t)(iVar6 - 1);
      } while (2 < iVar6);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      ppuVar9 = strings;
      do {
        lVar7 = 0;
        do {
          *(uchar *)((long)local_238 + lVar7) = ppuVar9[lVar7][depth];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        lVar7 = 0;
        ppuVar13 = ppuVar9;
        do {
          pvVar1 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                   (buckets + *(byte *)((long)local_238 + lVar7));
          iVar5._M_current = *(uchar ***)(pvVar1 + 8);
          if (iVar5._M_current == *(uchar ***)(pvVar1 + 0x10)) {
            std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
            _M_realloc_insert<unsigned_char*const&>(pvVar1,iVar5,ppuVar13);
          }
          else {
            *iVar5._M_current = *ppuVar13;
            *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
          }
          lVar7 = lVar7 + 1;
          ppuVar13 = ppuVar13 + 1;
        } while (lVar7 != 0x20);
        uVar10 = uVar10 + 0x20;
        ppuVar9 = ppuVar9 + 0x20;
      } while (uVar10 < (n & 0xffffffffffffffe0));
    }
    lVar7 = n - uVar10;
    if (uVar10 <= n && lVar7 != 0) {
      ppuVar9 = strings + uVar10;
      do {
        pvVar1 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                 (buckets + (*ppuVar9)[depth]);
        iVar5._M_current = *(uchar ***)(pvVar1 + 8);
        if (iVar5._M_current == *(uchar ***)(pvVar1 + 0x10)) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>(pvVar1,iVar5,ppuVar9);
        }
        else {
          *iVar5._M_current = *ppuVar9;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
        ppuVar9 = ppuVar9 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    pppuVar8 = &buckets[1].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    lVar7 = 0;
    do {
      uVar10 = (long)*pppuVar8 - (long)((_Vector_impl_data *)(pppuVar8 + -1))->_M_start;
      uVar16 = (undefined4)(uVar10 >> 3);
      auVar15._4_4_ = uVar16;
      auVar15._0_4_ = (int)((ulong)((long)pppuVar8[-3] - (long)pppuVar8[-4]) >> 3);
      auVar15._8_4_ = uVar16;
      auVar15._12_4_ = (uint)(uVar10 >> 0x23);
      auVar15 = pshuflw(auVar15,auVar15,0xe8);
      *(int *)(local_238 + lVar7) = auVar15._0_4_;
      lVar7 = lVar7 + 2;
      pppuVar8 = pppuVar8 + 6;
    } while (lVar7 != 0x100);
    pppuVar8 = &(buckets->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    lVar7 = 0;
    lVar14 = 0;
    do {
      uVar2 = local_238[lVar7];
      if ((ulong)uVar2 != 0) {
        __n = (long)*pppuVar8 - (long)((_Vector_impl_data *)(pppuVar8 + -1))->_M_start;
        if (__n != 0) {
          memmove(strings + lVar14,((_Vector_impl_data *)(pppuVar8 + -1))->_M_start,__n);
        }
        lVar14 = lVar14 + (ulong)uVar2;
      }
      lVar7 = lVar7 + 1;
      pppuVar8 = pppuVar8 + 3;
    } while (lVar7 != 0x100);
    lVar7 = 8;
    do {
      lVar14 = *(long *)((long)buckets + lVar7 + -8);
      if (*(long *)((long)&(buckets->
                           super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar7) != lVar14) {
        *(long *)((long)&(buckets->
                         super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar7) = lVar14;
      }
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x1808);
    uVar10 = (ulong)local_238[0];
    lVar7 = 1;
    do {
      n_00 = (ulong)local_238[lVar7];
      if (n_00 != 0) {
        msd_D<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                  (strings + uVar10,n_00,depth + 1,buckets);
        uVar10 = uVar10 + n_00;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}